

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression *
soul::ExpressionHelpers::fromIdentifier(Expression *__return_storage_ptr__,QualifiedIdentifier *q)

{
  bool bVar1;
  ModuleBase *this;
  ulong uVar2;
  IdentifierPath *in_RCX;
  string local_150;
  string local_130;
  string local_110;
  IdentifierPath local_f0;
  undefined1 local_98 [8];
  string resolvedUID;
  pool_ptr<soul::AST::ModuleBase> parentModule;
  string local_68;
  undefined1 local_38 [8];
  string text;
  QualifiedIdentifier *q_local;
  
  text.field_2._8_8_ = q;
  AST::QualifiedIdentifier::toString_abi_cxx11_((string *)local_38,q);
  bVar1 = std::operator==((string *)local_38,"wrap");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"clamp"), bVar1)) {
    std::__cxx11::string::string((string *)&local_68,(string *)local_38);
    createPrimitive(__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    goto LAB_004f92eb;
  }
  bVar1 = AST::QualifiedIdentifier::isSimplePath((QualifiedIdentifier *)text.field_2._8_8_);
  if (bVar1) {
    AST::ASTObject::getParentScope((ASTObject *)text.field_2._8_8_);
    AST::Scope::findModule((Scope *)((long)&resolvedUID.field_2 + 8));
    bVar1 = soul::pool_ptr::operator_cast_to_bool
                      ((pool_ptr *)(resolvedUID.field_2._M_local_buf + 8));
    if (bVar1) {
      this = pool_ptr<soul::AST::ModuleBase>::operator*
                       ((pool_ptr<soul::AST::ModuleBase> *)((long)&resolvedUID.field_2 + 8));
      AST::QualifiedIdentifier::getPath(&local_f0,(QualifiedIdentifier *)text.field_2._8_8_);
      resolvePartialNameAsUID_abi_cxx11_
                ((string *)local_98,(ExpressionHelpers *)this,(ModuleBase *)&local_f0,in_RCX);
      IdentifierPath::~IdentifierPath(&local_f0);
      uVar2 = std::__cxx11::string::empty();
      bVar1 = (uVar2 & 1) == 0;
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_110,(string *)local_38);
        std::__cxx11::string::string((string *)&local_130,(string *)local_98);
        createStruct(__return_storage_ptr__,&local_110,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
      }
      std::__cxx11::string::~string((string *)local_98);
      if (!bVar1) goto LAB_004f926f;
    }
    else {
LAB_004f926f:
      bVar1 = false;
    }
    pool_ptr<soul::AST::ModuleBase>::~pool_ptr
              ((pool_ptr<soul::AST::ModuleBase> *)((long)&resolvedUID.field_2 + 8));
    if (bVar1) goto LAB_004f92eb;
  }
  std::__cxx11::string::string((string *)&local_150,(string *)local_38);
  createText(__return_storage_ptr__,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
LAB_004f92eb:
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression fromIdentifier (AST::QualifiedIdentifier& q)
    {
        auto text = q.toString();

        if (text == "wrap" || text == "clamp")
            return createPrimitive (text);

        if (q.isSimplePath())
        {
            if (auto parentModule = q.getParentScope()->findModule())
            {
                auto resolvedUID = resolvePartialNameAsUID (*parentModule, q.getPath());

                if (! resolvedUID.empty())
                    return createStruct (text, resolvedUID);
            }
        }

        return createText (text);
    }